

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O3

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::ScreenGeometryEvent,QScreen*,QRect,QRect>
               (QScreen *args,QRect args_1,QRect args_2)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  undefined1 uVar4;
  int *piVar5;
  long in_FS_OFFSET;
  WindowSystemEvent local_80;
  int *local_68;
  QScreen *local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = QThread::isMainThread();
  if (cVar1 == '\0') {
    QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::
    handleEvent<QWindowSystemInterfacePrivate::ScreenGeometryEvent,QScreen*,QRect,QRect>
              (args,args_1,args_2);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      bVar2 = QWindowSystemInterface::flushWindowSystemEvents((ProcessEventsFlags)0x0);
      return bVar2;
    }
    goto LAB_0032f77b;
  }
  local_80.type = ScreenGeometry;
  local_80.flags = 0;
  local_80.eventAccepted = true;
  local_80._17_7_ = 0xaaaaaaaaaaaaaa;
  local_80._vptr_WindowSystemEvent = (_func_int **)&PTR__ScreenGeometryEvent_007d8fd0;
  if (args == (QScreen *)0x0) {
    local_68 = (int *)0x0;
  }
  else {
    local_68 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(&args->super_QObject);
  }
  local_60 = args;
  local_58 = args_1._0_8_;
  local_50 = args_1._8_8_;
  local_48 = args_2._0_8_;
  local_40 = args_2._8_8_;
  if (QWindowSystemInterfacePrivate::eventHandler == (QWindowSystemEventHandler *)0x0) {
    QGuiApplicationPrivate::processWindowSystemEvent(&local_80);
LAB_0032f731:
    uVar4 = local_80.eventAccepted;
  }
  else {
    iVar3 = (*QWindowSystemInterfacePrivate::eventHandler->_vptr_QWindowSystemEventHandler[2])
                      (QWindowSystemInterfacePrivate::eventHandler,&local_80);
    if ((char)iVar3 != '\0') goto LAB_0032f731;
    uVar4 = 0;
  }
  local_80._vptr_WindowSystemEvent = (_func_int **)&PTR__ScreenGeometryEvent_007d8fd0;
  if (local_68 != (int *)0x0) {
    LOCK();
    *local_68 = *local_68 + -1;
    UNLOCK();
    if (*local_68 == 0) {
      piVar5 = local_68;
      if (local_68 == (int *)0x0) {
        piVar5 = (int *)0x0;
      }
      operator_delete(piVar5);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)uVar4;
  }
LAB_0032f77b:
  __stack_chk_fail();
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent(Args ...args)
{
    if (QThread::isMainThread()) {
        EventType event(args...);
        // Process the event immediately on the Gui thread and return the accepted state
        if (QWindowSystemInterfacePrivate::eventHandler) {
            if (!QWindowSystemInterfacePrivate::eventHandler->sendEvent(&event))
                return false;
        } else {
            QGuiApplicationPrivate::processWindowSystemEvent(&event);
        }
        return event.eventAccepted;
    } else {
        // Post the event on the Qt main thread queue and flush the queue.
        // This will wake up the Gui thread which will process the event.
        // Return the accepted state for the last event on the queue,
        // which is the event posted by this function.
        QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
        return QWindowSystemInterface::flushWindowSystemEvents();
    }
}